

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemLauncher.cpp
# Opt level: O1

string * __thiscall
ApprovalTests::SystemLauncher::getUnixCommandLine
          (string *__return_storage_ptr__,SystemLauncher *this,string *commandLine,bool foreground)

{
  pointer pcVar1;
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,foreground) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (commandLine->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + commandLine->_M_string_length);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (commandLine->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + commandLine->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemLauncher::getUnixCommandLine(const std::string& commandLine,
                                                   bool foreground) const
    {
        std::string launch = foreground ? commandLine : (commandLine + " &");

        return launch;
    }